

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stddev.hpp
# Opt level: O2

void duckdb::STDDevSampOperation::Finalize<double,duckdb::StddevState>
               (StddevState *state,double *target,AggregateFinalizeData *finalize_data)

{
  bool bVar1;
  long lVar2;
  OutOfRangeException *this;
  double dVar3;
  undefined1 auVar4 [16];
  allocator local_39;
  string local_38;
  
  if (state->count < 2) {
    AggregateFinalizeData::ReturnNull(finalize_data);
    return;
  }
  lVar2 = state->count - 1;
  auVar4._8_4_ = (int)((ulong)lVar2 >> 0x20);
  auVar4._0_8_ = lVar2;
  auVar4._12_4_ = 0x45300000;
  dVar3 = state->dsquared /
          ((auVar4._8_8_ - 1.9342813113834067e+25) +
          ((double)CONCAT44(0x43300000,(int)lVar2) - 4503599627370496.0));
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  *target = dVar3;
  bVar1 = Value::DoubleIsFinite(dVar3);
  if (bVar1) {
    return;
  }
  this = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string((string *)&local_38,"STDDEV_SAMP is out of range!",&local_39);
  OutOfRangeException::OutOfRangeException(this,&local_38);
  __cxa_throw(this,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static void Finalize(STATE &state, T &target, AggregateFinalizeData &finalize_data) {
		if (state.count <= 1) {
			finalize_data.ReturnNull();
		} else {
			target = sqrt(state.dsquared / (state.count - 1));
			if (!Value::DoubleIsFinite(target)) {
				throw OutOfRangeException("STDDEV_SAMP is out of range!");
			}
		}
	}